

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O2

int shared_recover(int id)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  int idx;
  ulong uVar8;
  
  iVar4 = 0x9a;
  if ((shared_gt != (SHARED_GTAB *)0x0) && (shared_lt != (SHARED_LTAB *)0x0)) {
    lVar7 = 8;
    lVar5 = 0;
    iVar4 = 0;
    for (uVar8 = 0; (long)uVar8 < (long)shared_maxseg; uVar8 = uVar8 + 1) {
      if (((id == -1 || (uint)id == uVar8) && (*(int *)((long)&shared_lt->p + lVar7) == 0)) &&
         (*(int *)((long)&shared_gt->key + lVar5) != -1)) {
        idx = (int)uVar8;
        iVar2 = shared_mux(idx,3);
        if (iVar2 == 0) {
          uVar3 = shared_process_count(*(int *)((long)&shared_gt->sem + lVar5));
          uVar1 = *(uint *)((long)&shared_gt->nprocdebug + lVar5);
          if (uVar3 == 0 || (int)uVar3 < (int)uVar1) {
            if (shared_debug != 0) {
              printf("Bogus handle=%d nproc=%d sema=%d:",uVar8 & 0xffffffff,(ulong)uVar1,
                     (ulong)uVar3);
            }
            iVar4 = shared_destroy_entry(idx);
            if (shared_debug != 0) {
              pcVar6 = "error couldn\'t clear handle";
              if (iVar4 == 0) {
                pcVar6 = "handle cleared";
              }
              printf("%s",pcVar6);
            }
          }
          shared_demux(idx,1);
        }
      }
      lVar5 = lVar5 + 0x1c;
      lVar7 = lVar7 + 0x18;
    }
  }
  return iVar4;
}

Assistant:

int     shared_recover(int id)                  /* try to recover dormant segments after applic crash */
 { int i, r, r2;

   if (NULL == shared_gt) return(SHARED_NOTINIT);       /* not initialized */
   if (NULL == shared_lt) return(SHARED_NOTINIT);       /* not initialized */
   r = SHARED_OK;
   for (i=0; i<shared_maxseg; i++)
    { if (-1 != id) if (i != id) continue;
      if (shared_lt[i].tcnt) continue;          /* somebody (we) is using it */
      if (SHARED_INVALID == shared_gt[i].key) continue; /* unused slot */
      if (shared_mux(i, SHARED_NOWAIT | SHARED_RDWRITE)) continue; /* acquire exclusive access to segment, but do not wait */
      r2 = shared_process_count(shared_gt[i].sem);
      if ((shared_gt[i].nprocdebug > r2) || (0 == r2))
        { if (shared_debug) printf("Bogus handle=%d nproc=%d sema=%d:", i, shared_gt[i].nprocdebug, r2);
          r = shared_destroy_entry(i);
          if (shared_debug)
            { printf("%s", r ? "error couldn't clear handle" : "handle cleared");
            }
        }
      shared_demux(i, SHARED_RDWRITE);
    }
   return(r);                                           /* table full */
 }